

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O0

int ly_register_types(lytype_plugin_list *plugin,char *log_name)

{
  int iVar1;
  char *pcVar2;
  lytype_plugin_list *plVar3;
  char *local_58;
  uint local_30;
  uint local_2c;
  uint32_t v;
  uint32_t u;
  lytype_plugin_list *p;
  char *log_name_local;
  lytype_plugin_list *plugin_local;
  
  local_2c = 0;
  do {
    if (plugin[local_2c].name == (char *)0x0) {
      plVar3 = (lytype_plugin_list *)
               realloc(type_plugins,(ulong)(type_plugins_count + local_2c) * 0x28);
      if (plVar3 == (lytype_plugin_list *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_register_types"
              );
        plugin_local._4_4_ = -1;
      }
      else {
        for (; type_plugins = plVar3, local_2c != 0; local_2c = local_2c - 1) {
          memcpy(type_plugins + type_plugins_count,plugin + (local_2c - 1),0x28);
          type_plugins_count = type_plugins_count + 1;
          plVar3 = type_plugins;
        }
        plugin_local._4_4_ = 0;
      }
      return plugin_local._4_4_;
    }
    for (local_30 = 0; local_30 < type_plugins_count; local_30 = local_30 + 1) {
      iVar1 = strcmp(plugin[local_2c].name,type_plugins[local_30].name);
      if (((iVar1 == 0) &&
          (iVar1 = strcmp(plugin[local_2c].module,type_plugins[local_30].module), iVar1 == 0)) &&
         ((plugin[local_2c].revision == (char *)0x0 ||
          ((type_plugins[local_30].revision == (char *)0x0 ||
           (iVar1 = strcmp(plugin[local_2c].revision,type_plugins[local_30].revision), iVar1 == 0)))
          ))) {
        pcVar2 = "";
        if (plugin[local_2c].revision != (char *)0x0) {
          pcVar2 = "@";
        }
        if (plugin[local_2c].revision == (char *)0x0) {
          local_58 = "";
        }
        else {
          local_58 = plugin[local_2c].revision;
        }
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,
               "Processing \"%s\" extension plugin failed,implementation collision for extension %s from module %s%s%s."
               ,log_name,plugin[local_2c].name,plugin[local_2c].module,pcVar2,local_58);
        return 1;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

API int
ly_register_types(struct lytype_plugin_list *plugin, const char *log_name)
{
    struct lytype_plugin_list *p;
    uint32_t u, v;

    for (u = 0; plugin[u].name; u++) {
        /* check user type implementations for collisions */
        for (v = 0; v < type_plugins_count; v++) {
            if (!strcmp(plugin[u].name, type_plugins[v].name) &&
                    !strcmp(plugin[u].module, type_plugins[v].module) &&
                    (!plugin[u].revision || !type_plugins[v].revision || !strcmp(plugin[u].revision, type_plugins[v].revision))) {
                LOGERR(NULL, LY_ESYS, "Processing \"%s\" extension plugin failed,"
                        "implementation collision for extension %s from module %s%s%s.",
                        log_name, plugin[u].name, plugin[u].module, plugin[u].revision ? "@" : "",
                        plugin[u].revision ? plugin[u].revision : "");
                return 1;
            }
        }
    }

    /* add the new plugins, we have number of new plugins as u */
    p = realloc(type_plugins, (type_plugins_count + u) * sizeof *type_plugins);
    if (!p) {
        LOGMEM(NULL);
        return -1;
    }
    type_plugins = p;
    for (; u; u--) {
        memcpy(&type_plugins[type_plugins_count], &plugin[u - 1], sizeof *plugin);
        type_plugins_count++;
    }

    return 0;
}